

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_named_node_iterator * __thiscall
pugi::xml_named_node_iterator::operator--(xml_named_node_iterator *this)

{
  bool bVar1;
  xml_node xVar2;
  char_t *src;
  xml_named_node_iterator *this_local;
  
  if ((this->_wrap)._root == (xml_node_struct *)0x0) {
    xVar2 = xml_node::last_child(&this->_parent);
    (this->_wrap)._root = xVar2._root;
    src = xml_node::name(&this->_wrap);
    bVar1 = impl::anon_unknown_0::strequal(src,this->_name);
    if (!bVar1) {
      xVar2 = xml_node::previous_sibling(&this->_wrap,this->_name);
      (this->_wrap)._root = xVar2._root;
    }
  }
  else {
    xVar2 = xml_node::previous_sibling(&this->_wrap,this->_name);
    (this->_wrap)._root = xVar2._root;
  }
  return this;
}

Assistant:

PUGI__FN xml_named_node_iterator& xml_named_node_iterator::operator--()
	{
		if (_wrap._root)
			_wrap = _wrap.previous_sibling(_name);
		else
		{
			_wrap = _parent.last_child();

			if (!impl::strequal(_wrap.name(), _name))
				_wrap = _wrap.previous_sibling(_name);
		}

		return *this;
	}